

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerBailOnNotString(Lowerer *this,Instr *instr)

{
  OpCode opcode;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  Opnd *dstOpnd;
  Opnd *src1Opnd;
  Instr *instr_00;
  LabelInstr *continueLabel;
  LabelInstr *labelHelper;
  undefined4 *puVar4;
  RegOpnd *srcReg;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  local_32 = (instr->m_src1->m_valueType).field_0;
  bVar2 = ValueType::IsString((ValueType *)&local_32.field_0);
  if (bVar2) {
    IR::Instr::ClearBailOutInfo(instr);
  }
  else {
    opcode = instr->m_opcode;
    dstOpnd = IR::Instr::UnlinkDst(instr);
    src1Opnd = IR::Instr::UnlinkSrc1(instr);
    instr_00 = IR::Instr::New(opcode,dstOpnd,src1Opnd,instr->m_func);
    IR::Instr::InsertBefore(instr,instr_00);
    srcReg = (RegOpnd *)0x0;
    continueLabel = IR::LabelInstr::New(Label,this->m_func,false);
    labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertAfter(instr,&continueLabel->super_Instr);
    OVar3 = IR::Opnd::GetKind(instr_00->m_src1);
    if (OVar3 == OpndKindReg) {
      srcReg = (RegOpnd *)instr_00->m_src1;
      OVar3 = IR::Opnd::GetKind((Opnd *)srcReg);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    GenerateStringTest(this,srcReg,instr,labelHelper,continueLabel,true);
    GenerateBailOut(this,instr,(BranchInstr *)0x0,labelHelper,(LabelInstr *)0x0);
  }
  return;
}

Assistant:

void Lowerer::LowerBailOnNotString(IR::Instr *instr)
{
    if (!instr->GetSrc1()->GetValueType().IsString())
    {
        /*Creating a MOV instruction*/
        IR::Instr * movInstr = IR::Instr::New(instr->m_opcode, instr->UnlinkDst(), instr->UnlinkSrc1(), instr->m_func);
        instr->InsertBefore(movInstr);

        IR::LabelInstr *continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        IR::LabelInstr *helperLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        instr->InsertAfter(continueLabelInstr);

        IR::RegOpnd *srcReg = movInstr->GetSrc1()->IsRegOpnd() ? movInstr->GetSrc1()->AsRegOpnd() : nullptr;

        this->GenerateStringTest(srcReg, instr, helperLabelInstr, continueLabelInstr);
        this->GenerateBailOut(instr, nullptr, helperLabelInstr);
    }
    else
    {
        instr->ClearBailOutInfo();
    }
}